

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlAttrPtr xmlGetPropNodeInternal(xmlNode *node,xmlChar *name,xmlChar *nsName,int useDTD)

{
  _xmlDoc *p_Var1;
  bool bVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlNsPtr *ppxVar5;
  xmlAttributePtr pxVar6;
  xmlNsPtr *ppxVar7;
  xmlNsPtr pxVar8;
  xmlNsPtr *elem;
  xmlDoc *doc_00;
  _xmlDtd *dtd;
  xmlNsPtr *ppxVar9;
  xmlAttrPtr pxVar10;
  xmlNsPtr *ppxVar11;
  xmlDocPtr doc;
  
  if (node == (xmlNode *)0x0) {
    return (xmlAttrPtr)0x0;
  }
  if (name == (xmlChar *)0x0) {
    return (xmlAttrPtr)0x0;
  }
  if (node->type != XML_ELEMENT_NODE) {
    return (xmlAttrPtr)0x0;
  }
  pxVar10 = node->properties;
  if (pxVar10 != (xmlAttrPtr)0x0) {
    if (nsName == (xmlChar *)0x0) {
      do {
        if ((pxVar10->ns == (xmlNs *)0x0) && (iVar3 = xmlStrEqual(pxVar10->name,name), iVar3 != 0))
        {
          return pxVar10;
        }
        pxVar10 = pxVar10->next;
      } while (pxVar10 != (_xmlAttr *)0x0);
    }
    else {
      do {
        if ((pxVar10->ns != (xmlNs *)0x0) && (iVar3 = xmlStrEqual(pxVar10->name,name), iVar3 != 0))
        {
          pxVar4 = pxVar10->ns->href;
          if (pxVar4 == nsName) {
            return pxVar10;
          }
          iVar3 = xmlStrEqual(pxVar4,nsName);
          if (iVar3 != 0) {
            return pxVar10;
          }
        }
        pxVar10 = pxVar10->next;
      } while (pxVar10 != (_xmlAttr *)0x0);
    }
  }
  if (useDTD == 0) {
    return (xmlAttrPtr)0x0;
  }
  p_Var1 = node->doc;
  if (p_Var1 == (_xmlDoc *)0x0) {
    return (xmlAttrPtr)0x0;
  }
  if (p_Var1->intSubset == (_xmlDtd *)0x0) {
    return (xmlAttrPtr)0x0;
  }
  if ((node->ns == (xmlNs *)0x0) || (pxVar4 = node->ns->prefix, pxVar4 == (xmlChar *)0x0)) {
    elem = (xmlNsPtr *)node->name;
    ppxVar5 = (xmlNsPtr *)0x0;
LAB_00187cd9:
    if (nsName == (xmlChar *)0x0) {
      pxVar6 = xmlGetDtdQAttrDesc(p_Var1->intSubset,(xmlChar *)elem,name,(xmlChar *)0x0);
      if (pxVar6 == (xmlAttributePtr)0x0) {
        dtd = p_Var1->extSubset;
        if (dtd != (_xmlDtd *)0x0) {
          pxVar4 = (xmlChar *)0x0;
          goto LAB_00187d5c;
        }
LAB_00187e1f:
        pxVar6 = (xmlAttributePtr)0x0;
      }
    }
    else {
      doc_00 = (xmlDoc *)nsName;
      iVar3 = xmlStrEqual(nsName,(xmlChar *)"http://www.w3.org/XML/1998/namespace");
      if (iVar3 == 0) {
        ppxVar7 = xmlGetNsList(doc_00,node);
        if (ppxVar7 == (xmlNsPtr *)0x0) {
          pxVar6 = (xmlAttributePtr)0x0;
          ppxVar9 = ppxVar5;
          if (ppxVar5 != (xmlNsPtr *)0x0) goto LAB_00187e49;
        }
        else {
          pxVar8 = *ppxVar7;
          ppxVar11 = ppxVar7;
          ppxVar9 = ppxVar7;
          if (pxVar8 == (xmlNsPtr)0x0) {
            pxVar6 = (xmlAttributePtr)0x0;
          }
          else {
            do {
              iVar3 = xmlStrEqual(pxVar8->href,nsName);
              if ((iVar3 != 0) &&
                 ((pxVar6 = xmlGetDtdQAttrDesc(p_Var1->intSubset,(xmlChar *)elem,name,
                                               (*ppxVar11)->prefix), pxVar6 != (xmlAttributePtr)0x0
                  || ((p_Var1->extSubset != (xmlDtdPtr)0x0 &&
                      (pxVar6 = xmlGetDtdQAttrDesc(p_Var1->extSubset,(xmlChar *)elem,name,
                                                   (*ppxVar11)->prefix),
                      pxVar6 != (xmlAttributePtr)0x0)))))) goto LAB_00187e49;
              pxVar8 = ppxVar11[1];
              ppxVar11 = ppxVar11 + 1;
            } while (pxVar8 != (xmlNsPtr)0x0);
            pxVar6 = (xmlAttributePtr)0x0;
          }
LAB_00187e49:
          (*xmlFree)(ppxVar9);
        }
        if (ppxVar7 == (xmlNsPtr *)0x0) goto LAB_00187e5b;
      }
      else {
        pxVar6 = xmlGetDtdQAttrDesc(p_Var1->intSubset,(xmlChar *)elem,name,"xml");
        if (pxVar6 == (xmlAttributePtr)0x0) {
          dtd = p_Var1->extSubset;
          if (dtd == (_xmlDtd *)0x0) goto LAB_00187e1f;
          pxVar4 = "xml";
LAB_00187d5c:
          pxVar6 = xmlGetDtdQAttrDesc(dtd,(xmlChar *)elem,name,pxVar4);
        }
      }
    }
    if (ppxVar5 != (xmlNsPtr *)0x0) {
      (*xmlFree)(ppxVar5);
    }
    if ((pxVar6 != (xmlAttributePtr)0x0) && (pxVar6->defaultValue != (xmlChar *)0x0)) {
      bVar2 = false;
      goto LAB_00187e60;
    }
    bVar2 = true;
  }
  else {
    pxVar4 = xmlStrdup(pxVar4);
    pxVar4 = xmlStrcat(pxVar4,":");
    ppxVar5 = (xmlNsPtr *)xmlStrcat(pxVar4,node->name);
    elem = ppxVar5;
    if (ppxVar5 != (xmlNsPtr *)0x0) goto LAB_00187cd9;
LAB_00187e5b:
    bVar2 = false;
  }
  pxVar6 = (xmlAttributePtr)0x0;
LAB_00187e60:
  if (bVar2) {
    return (xmlAttrPtr)0x0;
  }
  return (xmlAttrPtr)pxVar6;
}

Assistant:

static xmlAttrPtr
xmlGetPropNodeInternal(const xmlNode *node, const xmlChar *name,
		       const xmlChar *nsName, int useDTD)
{
    xmlAttrPtr prop;

    /* Avoid unused variable warning if features are disabled. */
    (void) useDTD;

    if ((node == NULL) || (node->type != XML_ELEMENT_NODE) || (name == NULL))
	return(NULL);

    if (node->properties != NULL) {
	prop = node->properties;
	if (nsName == NULL) {
	    /*
	    * We want the attr to be in no namespace.
	    */
	    do {
		if ((prop->ns == NULL) && xmlStrEqual(prop->name, name)) {
		    return(prop);
		}
		prop = prop->next;
	    } while (prop != NULL);
	} else {
	    /*
	    * We want the attr to be in the specified namespace.
	    */
	    do {
		if ((prop->ns != NULL) && xmlStrEqual(prop->name, name) &&
		    ((prop->ns->href == nsName) ||
		     xmlStrEqual(prop->ns->href, nsName)))
		{
		    return(prop);
		}
		prop = prop->next;
	    } while (prop != NULL);
	}
    }

#ifdef LIBXML_TREE_ENABLED
    if (! useDTD)
	return(NULL);
    /*
     * Check if there is a default/fixed attribute declaration in
     * the internal or external subset.
     */
    if ((node->doc != NULL) && (node->doc->intSubset != NULL)) {
	xmlDocPtr doc = node->doc;
	xmlAttributePtr attrDecl = NULL;
	xmlChar *elemQName, *tmpstr = NULL;

	/*
	* We need the QName of the element for the DTD-lookup.
	*/
	if ((node->ns != NULL) && (node->ns->prefix != NULL)) {
	    tmpstr = xmlStrdup(node->ns->prefix);
	    tmpstr = xmlStrcat(tmpstr, BAD_CAST ":");
	    tmpstr = xmlStrcat(tmpstr, node->name);
	    if (tmpstr == NULL)
		return(NULL);
	    elemQName = tmpstr;
	} else
	    elemQName = (xmlChar *) node->name;
	if (nsName == NULL) {
	    /*
	    * The common and nice case: Attr in no namespace.
	    */
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset,
		elemQName, name, NULL);
	    if ((attrDecl == NULL) && (doc->extSubset != NULL)) {
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset,
		    elemQName, name, NULL);
	    }
        } else if (xmlStrEqual(nsName, XML_XML_NAMESPACE)) {
	    /*
	    * The XML namespace must be bound to prefix 'xml'.
	    */
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset,
		elemQName, name, BAD_CAST "xml");
	    if ((attrDecl == NULL) && (doc->extSubset != NULL)) {
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset,
		    elemQName, name, BAD_CAST "xml");
	    }
	} else {
	    xmlNsPtr *nsList, *cur;

	    /*
	    * The ugly case: Search using the prefixes of in-scope
	    * ns-decls corresponding to @nsName.
	    */
	    nsList = xmlGetNsList(node->doc, node);
	    if (nsList == NULL) {
		if (tmpstr != NULL)
		    xmlFree(tmpstr);
		return(NULL);
	    }
	    cur = nsList;
	    while (*cur != NULL) {
		if (xmlStrEqual((*cur)->href, nsName)) {
		    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, elemQName,
			name, (*cur)->prefix);
		    if (attrDecl)
			break;
		    if (doc->extSubset != NULL) {
			attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, elemQName,
			    name, (*cur)->prefix);
			if (attrDecl)
			    break;
		    }
		}
		cur++;
	    }
	    xmlFree(nsList);
	}
	if (tmpstr != NULL)
	    xmlFree(tmpstr);
	/*
	* Only default/fixed attrs are relevant.
	*/
	if ((attrDecl != NULL) && (attrDecl->defaultValue != NULL))
	    return((xmlAttrPtr) attrDecl);
    }
#endif /* LIBXML_TREE_ENABLED */
    return(NULL);
}